

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O0

StatusOr<bool> * __thiscall draco::PlyReader::ParseEndHeader(PlyReader *this,DecoderBuffer *buffer)

{
  bool bVar1;
  int iVar2;
  reference __s1;
  DecoderBuffer *in_RDX;
  StatusOr<bool> *in_RDI;
  array<char,_10UL> c;
  undefined4 in_stack_ffffffffffffff58;
  Code in_stack_ffffffffffffff5c;
  DecoderBuffer *in_stack_ffffffffffffff60;
  StatusOr<bool> *this_00;
  allocator<char> local_71;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  array<char,_10UL> local_22;
  DecoderBuffer *local_18;
  
  local_18 = in_RDX;
  parser::SkipWhitespace(in_stack_ffffffffffffff60);
  bVar1 = DecoderBuffer::Peek<std::array<char,10ul>>(local_18,&local_22);
  if (bVar1) {
    __s1 = std::array<char,_10UL>::operator[]
                     ((array<char,_10UL> *)in_stack_ffffffffffffff60,
                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    iVar2 = memcmp(__s1,"end_header",10);
    if (iVar2 == 0) {
      parser::SkipLine((DecoderBuffer *)0x13dff2);
      StatusOr<bool>::StatusOr
                ((StatusOr<bool> *)in_stack_ffffffffffffff60,
                 (bool *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    else {
      StatusOr<bool>::StatusOr
                ((StatusOr<bool> *)in_stack_ffffffffffffff60,
                 (bool *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
  }
  else {
    this_00 = (StatusOr<bool> *)&local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    Status::Status(&this_00->status_,in_stack_ffffffffffffff5c,(string *)0x13df21);
    StatusOr<bool>::StatusOr
              (this_00,(Status *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    Status::~Status((Status *)0x13df3e);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    std::allocator<char>::~allocator(&local_71);
  }
  return in_RDI;
}

Assistant:

StatusOr<bool> PlyReader::ParseEndHeader(DecoderBuffer *buffer) {
  parser::SkipWhitespace(buffer);
  std::array<char, 10> c;
  if (!buffer->Peek(&c)) {
    return Status(Status::INVALID_PARAMETER,
                  "End of file reached before the end_header");
  }
  if (std::memcmp(&c[0], "end_header", 10) != 0) {
    return false;
  }
  parser::SkipLine(buffer);
  return true;
}